

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O3

void test_abs<float>(uint length)

{
  float fVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined1 auVar9 [12];
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  int iVar14;
  undefined1 (*pauVar15) [12];
  undefined8 *puVar16;
  ulong uVar17;
  uint uVar18;
  undefined1 (*pauVar19) [12];
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  shared_ptr<float> pv;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  
  uVar21 = (ulong)length;
  uVar17 = 0xffffffffffffffff;
  if (-1 < (int)length) {
    uVar17 = uVar21 * 4;
  }
  pauVar15 = (undefined1 (*) [12])operator_new__(uVar17);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<float*,void(*)(float*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv,pauVar15,nosimd::common::free<float>)
  ;
  if (0 < (int)length) {
    iVar14 = 0;
    uVar17 = 0;
    do {
      *(float *)(*pauVar15 + uVar17 * 4) = (float)iVar14;
      uVar17 = uVar17 + 1;
      iVar14 = iVar14 + -1;
    } while (uVar21 != uVar17);
    pauVar19 = pauVar15;
    uVar20 = length;
    uVar18 = length;
    if (7 < (int)length) {
      do {
        uVar20 = *(uint *)(*pauVar19 + 8);
        uVar5 = *(uint *)pauVar19[1];
        local_48 = *(uint *)*(undefined1 (*) [12])(pauVar19[1] + 4);
        uStack_44 = *(uint *)(pauVar19[1] + 8);
        uStack_40 = *(uint *)pauVar19[2];
        auVar9 = *(undefined1 (*) [12])(pauVar19[1] + 4);
        uVar7 = *(uint *)(pauVar19[2] + 4);
        uVar22 = *(uint *)*pauVar19;
        uVar23 = *(uint *)(*pauVar19 + 4);
        if (sse::internals::abs_ps(float(int))::sign_mask == '\0') {
          pv.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
               *(uint *)*pauVar19;
          pv.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
               *(uint *)(*pauVar19 + 4);
          test_abs<float>();
          local_48 = auVar9._0_4_;
          uStack_44 = auVar9._4_4_;
          uStack_40 = auVar9._8_4_;
          uVar22 = (uint)pv.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          uVar23 = pv.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_;
        }
        uVar13 = sse::internals::abs_ps(float(int))::sign_mask._12_4_;
        uVar12 = sse::internals::abs_ps(float(int))::sign_mask._8_4_;
        uVar11 = sse::internals::abs_ps(float(int))::sign_mask._4_4_;
        uVar10 = sse::internals::abs_ps(float(int))::sign_mask._0_4_;
        if (sse::internals::abs_ps(float(int))::sign_mask == '\0') {
          pv.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = uVar22;
          pv.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = uVar23;
          test_abs<float>();
          uVar22 = (uint)pv.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          uVar23 = pv.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_;
        }
        uVar3 = ~sse::internals::abs_ps(float(int))::sign_mask._0_4_;
        uVar4 = ~sse::internals::abs_ps(float(int))::sign_mask._4_4_;
        uVar6 = ~sse::internals::abs_ps(float(int))::sign_mask._8_4_;
        uVar8 = ~sse::internals::abs_ps(float(int))::sign_mask._12_4_;
        *(uint *)*pauVar19 = ~uVar10 & uVar22;
        *(uint *)(*pauVar19 + 4) = ~uVar11 & uVar23;
        *(uint *)(*pauVar19 + 8) = ~uVar12 & uVar20;
        *(uint *)pauVar19[1] = ~uVar13 & uVar5;
        *(uint *)(pauVar19[1] + 4) = uVar3 & local_48;
        *(uint *)(pauVar19[1] + 8) = uVar4 & uStack_44;
        *(uint *)pauVar19[2] = uVar6 & uStack_40;
        *(uint *)(pauVar19[2] + 4) = uVar8 & uVar7;
        uVar20 = uVar18 - 8;
        pauVar19 = (undefined1 (*) [12])(pauVar19[2] + 8);
        bVar2 = 0xf < (int)uVar18;
        uVar18 = uVar20;
      } while (bVar2);
    }
    if (3 < (int)uVar20) {
      local_48 = *(uint *)*pauVar19;
      uStack_44 = *(uint *)(*pauVar19 + 4);
      uStack_40 = *(uint *)(*pauVar19 + 8);
      auVar9 = *pauVar19;
      uVar18 = *(uint *)pauVar19[1];
      if (sse::internals::abs_ps(float(int))::sign_mask == '\0') {
        test_abs<float>();
        local_48 = auVar9._0_4_;
        uStack_44 = auVar9._4_4_;
        uStack_40 = auVar9._8_4_;
      }
      uVar5 = ~sse::internals::abs_ps(float(int))::sign_mask._4_4_;
      uVar7 = ~sse::internals::abs_ps(float(int))::sign_mask._8_4_;
      uVar22 = ~sse::internals::abs_ps(float(int))::sign_mask._12_4_;
      *(uint *)*pauVar19 = ~sse::internals::abs_ps(float(int))::sign_mask._0_4_ & local_48;
      *(uint *)(*pauVar19 + 4) = uVar5 & uStack_44;
      *(uint *)(*pauVar19 + 8) = uVar7 & uStack_40;
      *(uint *)pauVar19[1] = uVar22 & uVar18;
      uVar20 = uVar20 - 4;
      pauVar19 = (undefined1 (*) [12])(pauVar19[1] + 4);
    }
    if (0 < (int)uVar20) {
      iVar14 = uVar20 + 1;
      do {
        uVar20 = *(uint *)*pauVar19;
        if (sse::internals::abs_ps(float(int))::sign_mask == '\0') {
          test_abs<float>();
        }
        *(uint *)*pauVar19 = ~sse::internals::abs_ps(float(int))::sign_mask._0_4_ & uVar20;
        pauVar19 = (undefined1 (*) [12])(*pauVar19 + 4);
        iVar14 = iVar14 + -1;
      } while (1 < iVar14);
    }
    if (0 < (int)length) {
      uVar17 = 0;
      do {
        fVar1 = *(float *)(*pauVar15 + uVar17 * 4);
        if ((fVar1 < 0.0) && ((fVar1 != 1.1754944e-38 || (NAN(fVar1))))) {
          puVar16 = (undefined8 *)__cxa_allocate_exception(0x10);
          *puVar16 = "void test_abs(unsigned int) [T = float]";
          *(undefined4 *)(puVar16 + 1) = 0x81;
          *(uint *)((long)puVar16 + 0xc) = length;
          __cxa_throw(puVar16,&Exception::typeinfo,0);
        }
        uVar17 = uVar17 + 1;
      } while (uVar21 != uVar17);
    }
  }
  if (pv.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_abs(unsigned length = 47)
{
    auto pv = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    T * v = pv.get();

    for (int i = 0; i < (int)length; ++i)
        v[i] = -i;

    simd::abs(v, v, length);

    for (int i = 0; i < (int)length; ++i)
    {
        if (v[i] < 0 && v[i] != std::numeric_limits<T>::min())
            FAIL();
    }
}